

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.hpp
# Opt level: O3

queue_params_t * __thiscall
so_5::disp::mpsc_queue_traits::queue_params_t::operator=(queue_params_t *this,queue_params_t *o)

{
  _Manager_type p_Var1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  _Any_data __tmp;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  void *local_18;
  undefined8 uStack_10;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  p_Var2 = (o->m_lock_factory).super__Function_base._M_manager;
  p_Var3 = (o->m_lock_factory)._M_invoker;
  if ((o->m_lock_factory).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(o->m_lock_factory).super__Function_base._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(o->m_lock_factory).super__Function_base._M_functor + 8)
    ;
    (o->m_lock_factory).super__Function_base._M_manager = (_Manager_type)0x0;
    (o->m_lock_factory)._M_invoker = (_Invoker_type)0x0;
  }
  local_18 = *(void **)&(this->m_lock_factory).super__Function_base._M_functor;
  uStack_10 = *(undefined8 *)((long)&(this->m_lock_factory).super__Function_base._M_functor + 8);
  *(void **)&(this->m_lock_factory).super__Function_base._M_functor = local_38._M_unused._M_object;
  *(undefined8 *)((long)&(this->m_lock_factory).super__Function_base._M_functor + 8) =
       local_38._8_8_;
  local_28 = (this->m_lock_factory).super__Function_base._M_manager;
  p_Stack_20 = (this->m_lock_factory)._M_invoker;
  p_Var1 = (this->m_lock_factory).super__Function_base._M_manager;
  (this->m_lock_factory).super__Function_base._M_manager = p_Var2;
  (this->m_lock_factory)._M_invoker = p_Var3;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._M_object = local_18;
    local_38._8_8_ = uStack_10;
    (*p_Var1)(&local_38,&local_38,__destroy_functor);
  }
  return this;
}

Assistant:

queue_params_t & operator=( queue_params_t && o )
			{
				queue_params_t tmp{ std::move(o) };
				swap( *this, tmp );
				return *this;
			}